

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alldiff.cpp
# Opt level: O2

bool __thiscall AllDiffDomain<0>::propagate(AllDiffDomain<0> *this)

{
  int *piVar1;
  bool bVar2;
  Node *pNVar3;
  int i;
  long lVar4;
  ulong uVar5;
  Node *pNVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  int i_2;
  long lVar10;
  iterator i_1;
  
  piVar1 = &this->queue;
LAB_00146a22:
  this->queue_tail = piVar1;
  pNVar3 = this->var_nodes;
  pNVar6 = (Node *)piVar1;
  for (lVar4 = 0; lVar4 < this->sz; lVar4 = lVar4 + 1) {
    if ((pNVar3->match).v < 0) {
      pNVar6->next = (int)lVar4;
      this->queue_tail = &pNVar3->next;
      pNVar6 = pNVar3;
    }
    pNVar3 = pNVar3 + 1;
  }
  pNVar6->next = -1;
  pNVar3 = this->val_nodes;
  uVar5 = (ulong)(uint)this->range;
  if (this->range < 1) {
    uVar5 = 0;
  }
  for (lVar4 = 0; uVar5 * 0x14 - lVar4 != 0; lVar4 = lVar4 + 0x14) {
    (&pNVar3->mark)[lVar4] = false;
  }
  do {
    uVar8 = *piVar1;
    if ((int)uVar8 < 0) {
      this->index = 0;
      this->stack = -1;
      iVar9 = this->sz;
      uVar8 = this->range + iVar9;
      pNVar3 = this->var_nodes;
      uVar7 = 0;
      uVar5 = (ulong)uVar8;
      if ((int)uVar8 < 1) {
        uVar5 = uVar7;
      }
      for (; uVar5 * 0x14 - uVar7 != 0; uVar7 = uVar7 + 0x14) {
        (&pNVar3->mark)[uVar7] = false;
      }
      lVar4 = 0x11;
      for (lVar10 = 0; lVar10 < iVar9; lVar10 = lVar10 + 1) {
        if (*(char *)((long)&this->var_nodes->next + lVar4) == '\0') {
          bVar2 = tarjan(this,(int)lVar10);
          if (!bVar2) break;
          iVar9 = this->sz;
        }
        lVar4 = lVar4 + 0x14;
      }
      return iVar9 <= lVar10;
    }
    this->queue_tail = piVar1;
    if (-1 < (int)uVar8) break;
    *this->queue_tail = -1;
  } while( true );
  i_1.view = this->x + uVar8;
  i_1.forward.var = this->x[uVar8].var;
  i_1.forward.val = ((i_1.forward.var)->min).v;
  do {
    uVar5 = (ulong)(uint)i_1.forward.val;
    pNVar3 = this->val_nodes;
    lVar4 = (long)i_1.forward.val;
    if (pNVar3[lVar4].mark == false) {
      iVar9 = pNVar3[lVar4].match.v;
      if ((long)iVar9 < 0) break;
      pNVar3[lVar4].mark = true;
      pNVar3[lVar4].next = uVar8;
      *this->queue_tail = iVar9;
      this->queue_tail = &this->var_nodes[iVar9].next;
    }
    IntVar::iterator::operator++(&i_1.forward);
  } while( true );
  while( true ) {
    iVar9 = (int)uVar5;
    uVar5 = (ulong)this->var_nodes[(int)uVar8].match.v;
    Tint::operator=(&pNVar3[iVar9].match,uVar8);
    Tint::operator=(&this->var_nodes[(int)uVar8].match,iVar9);
    if ((long)uVar5 < 0) break;
    pNVar3 = this->val_nodes;
    uVar8 = pNVar3[uVar5].next;
  }
  goto LAB_00146a22;
}

Assistant:

bool propagate() override {
		// fprintf(stderr, "AllDiffDomain::propagate()\n");
		//  Edmonds-Karp, loop to find and augment a path
		while (true) {
			int var;
			int val;

			// visit source
			queue_tail = &queue;
			for (int i = 0; i < sz; ++i) {
				if (var_nodes[i].match < 0) {
					*queue_tail = i;
					queue_tail = &var_nodes[i].next;
				}
			}
			*queue_tail = -1;
			for (int i = 0; i < range; ++i) {
				val_nodes[i].mark = false;
			}

			// visit vars, also subsume visit of vals
			while (queue >= 0) {
				queue_tail = &queue;
				for (var = queue; var >= 0; var = var_nodes[var].next) {
					for (typename IntView<U>::iterator i = x[var].begin(); i != x[var].end(); ++i) {
						val = *i;
						if (!val_nodes[val].mark) {
							assert(val != var_nodes[var].match);
							const int next_var = val_nodes[val].match;
							if (next_var < 0) {
								goto augment;
							}

							val_nodes[val].mark = true;
							val_nodes[val].next = var;
							*queue_tail = next_var;
							queue_tail = &var_nodes[next_var].next;
						}
					}
				}
				*queue_tail = -1;
			}

			// no more augmenting paths
			break;

		augment:
			// found an augmenting path
			while (true) {
				const int parent_val = var_nodes[var].match;
				val_nodes[val].match = var;
				var_nodes[var].match = val;
				if (parent_val < 0) {
					break;
				}
				val = parent_val;
				var = val_nodes[val].next;
			}
		}
		// fprintf(stderr, "match");
		// for (int i = 0; i < sz; ++i)
		//  fprintf(stderr, " %d", var_nodes[i].match);
		// fprintf(stderr, "\n");

		index = 0;
		stack = -1;
		for (int i = 0; i < sz + range; ++i) {
			var_nodes[i].mark = false;
		}
		for (int i = 0; i < sz; ++i) {
			if (!var_nodes[i].mark && !tarjan(i)) {
				return false;
			}
		}

		return true;
	}